

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManComputeDistanceInt(Gia_Man_t *p,int iTarg,Vec_Int_t *vObjs,int fVerbose)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *vRes;
  Vec_Int_t *p_01;
  Vec_Int_t t;
  Vec_Int_t *vNexts;
  Vec_Int_t *vStart;
  Vec_Int_t *vDists;
  uint local_28;
  int iObj;
  int i;
  int fVerbose_local;
  Vec_Int_t *vObjs_local;
  int iTarg_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  vRes = Vec_IntAlloc(100);
  iVar3 = Gia_ManObjNum(p);
  p_01 = Vec_IntStart(iVar3);
  Gia_ManIncrementTravId(p);
  if (vObjs == (Vec_Int_t *)0x0) {
    Gia_ObjSetTravIdCurrentId(p,iTarg);
    Vec_IntWriteEntry(p_01,iTarg,1);
    Vec_IntPush(p_00,iTarg);
  }
  else {
    for (local_28 = 0; iVar3 = Vec_IntSize(vObjs), (int)local_28 < iVar3; local_28 = local_28 + 1) {
      iVar3 = Vec_IntEntry(vObjs,local_28);
      Gia_ObjSetTravIdCurrentId(p,iVar3);
      Vec_IntWriteEntry(p_01,iVar3,1);
      Vec_IntPush(p_00,iVar3);
    }
  }
  local_28 = 0;
  while( true ) {
    if (fVerbose != 0) {
      iVar3 = Vec_IntSize(p_01);
      iVar4 = Vec_IntCountZero(p_01);
      printf("Ring %2d : %6d\n",(ulong)local_28,(ulong)(uint)(iVar3 - iVar4));
    }
    Gia_ManCollectRing(p,p_00,vRes,p_01);
    iVar3 = Vec_IntSize(vRes);
    if (iVar3 == 0) break;
    Vec_IntClear(p_00);
    iVar4 = p_00->nCap;
    iVar2 = p_00->nSize;
    piVar1 = p_00->pArray;
    iVar3 = vRes->nSize;
    p_00->nCap = vRes->nCap;
    p_00->nSize = iVar3;
    p_00->pArray = vRes->pArray;
    vRes->nCap = iVar4;
    vRes->nSize = iVar2;
    vRes->pArray = piVar1;
    local_28 = local_28 + 1;
  }
  Vec_IntFree(p_00);
  Vec_IntFree(vRes);
  return p_01;
}

Assistant:

Vec_Int_t * Gia_ManComputeDistanceInt( Gia_Man_t * p, int iTarg, Vec_Int_t * vObjs, int fVerbose )
{
    int i, iObj;
    Vec_Int_t * vDists, * vStart, * vNexts;
    vStart = Vec_IntAlloc( 100 );
    vNexts = Vec_IntAlloc( 100 );
    vDists = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    if ( vObjs )
    {
        Vec_IntForEachEntry( vObjs, iObj, i )
        {
            Gia_ObjSetTravIdCurrentId(p, iObj);
            Vec_IntWriteEntry( vDists, iObj, 1 );
            Vec_IntPush( vStart, iObj );
        }
    }
    else
    {
        Gia_ObjSetTravIdCurrentId(p, iTarg);
        Vec_IntWriteEntry( vDists, iTarg, 1 );
        Vec_IntPush( vStart, iTarg );
    }
    for ( i = 0; ; i++ )
    {
        if ( fVerbose )
            printf( "Ring %2d : %6d\n", i, Vec_IntSize(vDists)-Vec_IntCountZero(vDists) );        
        Gia_ManCollectRing( p, vStart, vNexts, vDists );
        if ( Vec_IntSize(vNexts) == 0 )
            break;
        Vec_IntClear( vStart );
        ABC_SWAP( Vec_Int_t, *vStart, *vNexts );
    }
    Vec_IntFree( vStart );
    Vec_IntFree( vNexts );
    return vDists;
}